

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::InterpreterStackFrame::
OP_LdEnvObjSlot<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  UnsignedType UVar1;
  DWORD DVar2;
  Var pvVar3;
  
  pvVar3 = OP_LdFrameDisplaySlot(this,instance,playout->SlotIndex1);
  UVar1 = playout->SlotIndex2;
  DVar2 = DynamicObject::GetOffsetOfAuxSlots();
  return *(Var *)(*(long *)((long)pvVar3 + (ulong)DVar2) + (long)(int)UVar1 * 8);
}

Assistant:

Var InterpreterStackFrame::OP_LdEnvObjSlot(Var instance, const unaligned T* playout)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, playout->SlotIndex1);
        return OP_LdObjSlot(slotArray, playout->SlotIndex2);
    }